

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImDrawList_PathLineTo(ImDrawList *self,ImVec2 pos)

{
  ImVec2 local_8;
  
  local_8 = pos;
  ImVector<ImVec2>::push_back(&self->_Path,&local_8);
  return;
}

Assistant:

CIMGUI_API void ImDrawList_PathLineTo(ImDrawList* self,const ImVec2 pos)
{
    return self->PathLineTo(pos);
}